

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O0

void __thiscall agg::trans_double_path::finalize_paths(trans_double_path *this)

{
  uint uVar1;
  double dVar2;
  trans_double_path *this_local;
  
  if (this->m_status1 == making_path) {
    uVar1 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
    if ((1 < uVar1) && (this->m_status2 == making_path)) {
      uVar1 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&(this->m_src_vertices2).super_pod_bvector<agg::vertex_dist,_6U>);
      if (1 < uVar1) {
        dVar2 = finalize_path(this,&this->m_src_vertices1);
        this->m_kindex1 = dVar2;
        dVar2 = finalize_path(this,&this->m_src_vertices2);
        this->m_kindex2 = dVar2;
        this->m_status1 = ready;
        this->m_status2 = ready;
      }
    }
  }
  return;
}

Assistant:

void trans_double_path::finalize_paths()
    {
        if(m_status1 == making_path && m_src_vertices1.size() > 1 &&
           m_status2 == making_path && m_src_vertices2.size() > 1)
        {
            m_kindex1 = finalize_path(m_src_vertices1);
            m_kindex2 = finalize_path(m_src_vertices2);
            m_status1 = ready;
            m_status2 = ready;
        }
    }